

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies.cc
# Opt level: O1

bool __thiscall
bssl::ParsePolicyConstraints(bssl *this,Input policy_constraints_tlv,ParsedPolicyConstraints *out)

{
  Input in;
  bool bVar1;
  Input input;
  uint8_t inhibit_policy_mapping;
  optional<bssl::der::Input> inhibit_value;
  Parser sequence_parser;
  optional<bssl::der::Input> require_value;
  Parser parser;
  byte local_79;
  _Storage<bssl::der::Input,_true> local_78;
  char local_68;
  Parser local_60;
  _Storage<bssl::der::Input,_true> local_48;
  char local_38;
  Parser local_30;
  
  input.data_.size_ = (size_t)policy_constraints_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_30,input);
  der::Parser::Parser(&local_60);
  bVar1 = der::Parser::ReadSequence(&local_30,&local_60);
  if ((bVar1) && (bVar1 = der::Parser::HasMore(&local_60), bVar1)) {
    local_38 = '\0';
    bVar1 = der::Parser::ReadOptionalTag
                      (&local_60,0x80000000,(optional<bssl::der::Input> *)&local_48._M_value);
    if (bVar1) {
      if (local_38 == '\x01') {
        bVar1 = der::ParseUint8(local_48._M_value,(uint8_t *)&local_78);
        if (!bVar1) {
          return false;
        }
        *(ushort *)policy_constraints_tlv.data_.size_ = (byte)local_78._0_1_ | 0x100;
      }
      local_68 = '\0';
      bVar1 = der::Parser::ReadOptionalTag
                        (&local_60,0x80000001,(optional<bssl::der::Input> *)&local_78._M_value);
      if (bVar1) {
        if (local_68 == '\x01') {
          in.data_._1_15_ = local_78._1_15_;
          in.data_.data_._0_1_ = local_78._0_1_;
          bVar1 = der::ParseUint8(in,&local_79);
          if (!bVar1) {
            return false;
          }
          ((ushort *)policy_constraints_tlv.data_.size_)[1] = local_79 | 0x100;
        }
        bVar1 = der::Parser::HasMore(&local_60);
        if (!bVar1) {
          bVar1 = der::Parser::HasMore(&local_30);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParsePolicyConstraints(der::Input policy_constraints_tlv,
                            ParsedPolicyConstraints *out) {
  der::Parser parser(policy_constraints_tlv);

  //   PolicyConstraints ::= SEQUENCE {
  der::Parser sequence_parser;
  if (!parser.ReadSequence(&sequence_parser)) {
    return false;
  }

  // RFC 5280 prohibits CAs from issuing PolicyConstraints as an empty sequence:
  //
  //   Conforming CAs MUST NOT issue certificates where policy constraints
  //   is an empty sequence.  That is, either the inhibitPolicyMapping field
  //   or the requireExplicitPolicy field MUST be present.  The behavior of
  //   clients that encounter an empty policy constraints field is not
  //   addressed in this profile.
  if (!sequence_parser.HasMore()) {
    return false;
  }

  std::optional<der::Input> require_value;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                       &require_value)) {
    return false;
  }

  if (require_value) {
    uint8_t require_explicit_policy;
    if (!ParseUint8(require_value.value(), &require_explicit_policy)) {
      // TODO(eroman): Surface reason for failure if length was longer than
      // uint8.
      return false;
    }
    out->require_explicit_policy = require_explicit_policy;
  }

  std::optional<der::Input> inhibit_value;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 1,
                                       &inhibit_value)) {
    return false;
  }

  if (inhibit_value) {
    uint8_t inhibit_policy_mapping;
    if (!ParseUint8(inhibit_value.value(), &inhibit_policy_mapping)) {
      // TODO(eroman): Surface reason for failure if length was longer than
      // uint8.
      return false;
    }
    out->inhibit_policy_mapping = inhibit_policy_mapping;
  }

  // There should be no remaining data.
  if (sequence_parser.HasMore() || parser.HasMore()) {
    return false;
  }

  return true;
}